

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall google::protobuf::FieldDescriptorProto::Clear(FieldDescriptorProto *this)

{
  ulong uVar1;
  FieldOptions *this_00;
  anon_union_80_1_493b367e_for_FieldDescriptorProto_32 aVar2;
  undefined8 *puVar3;
  char *failure_msg;
  int line;
  char *file;
  LogMessageFatal local_20;
  
  aVar2 = this->field_0;
  if (((undefined1  [80])aVar2 & (undefined1  [80])0x3f) == (undefined1  [80])0x0)
  goto LAB_0025869c;
  if (((undefined1  [80])aVar2 & (undefined1  [80])0x1) != (undefined1  [80])0x0) {
    uVar1 = *(ulong *)((long)&this->field_0 + 8);
    if ((uVar1 & 3) != 0) {
      puVar3 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
      puVar3[1] = 0;
      *(undefined1 *)*puVar3 = 0;
      goto LAB_002585fc;
    }
LAB_002586ea:
    file = 
    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arenastring.h"
    ;
    failure_msg = "!tagged_ptr_.IsDefault()";
    line = 0x20b;
LAB_00258705:
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              (&local_20,file,line,failure_msg);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
  }
LAB_002585fc:
  if (((undefined1  [80])aVar2 & (undefined1  [80])0x2) != (undefined1  [80])0x0) {
    uVar1 = *(ulong *)((long)&this->field_0 + 0x10);
    if ((uVar1 & 3) == 0) goto LAB_002586ea;
    puVar3 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    puVar3[1] = 0;
    *(undefined1 *)*puVar3 = 0;
  }
  if (((undefined1  [80])aVar2 & (undefined1  [80])0x4) != (undefined1  [80])0x0) {
    uVar1 = *(ulong *)((long)&this->field_0 + 0x18);
    if ((uVar1 & 3) == 0) goto LAB_002586ea;
    puVar3 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    puVar3[1] = 0;
    *(undefined1 *)*puVar3 = 0;
  }
  if (((undefined1  [80])aVar2 & (undefined1  [80])0x8) != (undefined1  [80])0x0) {
    uVar1 = *(ulong *)((long)&this->field_0 + 0x20);
    if ((uVar1 & 3) == 0) goto LAB_002586ea;
    puVar3 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    puVar3[1] = 0;
    *(undefined1 *)*puVar3 = 0;
  }
  if (((undefined1  [80])aVar2 & (undefined1  [80])0x10) != (undefined1  [80])0x0) {
    uVar1 = *(ulong *)((long)&this->field_0 + 0x28);
    if ((uVar1 & 3) == 0) goto LAB_002586ea;
    puVar3 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
    puVar3[1] = 0;
    *(undefined1 *)*puVar3 = 0;
  }
  if (((undefined1  [80])aVar2 & (undefined1  [80])0x20) != (undefined1  [80])0x0) {
    this_00 = (this->field_0)._impl_.options_;
    if (this_00 == (FieldOptions *)0x0) {
      file = 
      "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.pb.cc"
      ;
      failure_msg = "_impl_.options_ != nullptr";
      line = 0x15aa;
      goto LAB_00258705;
    }
    FieldOptions::Clear(this_00);
  }
LAB_0025869c:
  if (((undefined1  [80])aVar2 & (undefined1  [80])0xc0) != (undefined1  [80])0x0) {
    *(undefined8 *)((long)&this->field_0 + 0x38) = 0;
  }
  if (((undefined1  [80])aVar2 & (undefined1  [80])0x700) != (undefined1  [80])0x0) {
    (this->field_0)._impl_.proto3_optional_ = false;
    *(undefined8 *)((long)&this->field_0 + 0x44) = 0x100000001;
  }
  (this->field_0)._impl_._has_bits_.has_bits_[0] = 0;
  if (((this->super_Message).super_MessageLite._internal_metadata_.ptr_ & 1) == 0) {
    return;
  }
  internal::InternalMetadata::DoClear<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

PROTOBUF_NOINLINE void FieldDescriptorProto::Clear() {
// @@protoc_insertion_point(message_clear_start:google.protobuf.FieldDescriptorProto)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  cached_has_bits = _impl_._has_bits_[0];
  if ((cached_has_bits & 0x0000003fu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _impl_.name_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _impl_.extendee_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _impl_.type_name_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      _impl_.default_value_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      _impl_.json_name_.ClearNonDefaultToEmpty();
    }
    if ((cached_has_bits & 0x00000020u) != 0) {
      ABSL_DCHECK(_impl_.options_ != nullptr);
      _impl_.options_->Clear();
    }
  }
  if ((cached_has_bits & 0x000000c0u) != 0) {
    ::memset(&_impl_.number_, 0, static_cast<::size_t>(
        reinterpret_cast<char*>(&_impl_.oneof_index_) -
        reinterpret_cast<char*>(&_impl_.number_)) + sizeof(_impl_.oneof_index_));
  }
  if ((cached_has_bits & 0x00000700u) != 0) {
    _impl_.proto3_optional_ = false;
    _impl_.label_ = 1;
    _impl_.type_ = 1;
  }
  _impl_._has_bits_.Clear();
  _internal_metadata_.Clear<::google::protobuf::UnknownFieldSet>();
}